

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

bb_t_conflict create_bb(gen_ctx_t gen_ctx,MIR_insn_t insn)

{
  uint uVar1;
  bb_t_conflict bb;
  bitmap_t pVVar2;
  bitmap_el_t *pbVar3;
  bb_insn_t_conflict elem;
  undefined8 *puVar4;
  undefined1 auVar5 [32];
  
  bb = (bb_t_conflict)gen_malloc(gen_ctx,0xa8);
  bb->loop_node = (loop_node_t_conflict)0x0;
  pVVar2 = (bitmap_t)malloc(0x18);
  pVVar2->els_num = 0;
  bb->bfs = 0;
  bb->pre = 0;
  bb->rpost = 0;
  pVVar2->size = 4;
  auVar5 = ZEXT432(0) << 0x40;
  (bb->in_edges).head = (in_edge_t_conflict)SUB168(auVar5._0_16_,0);
  (bb->in_edges).tail = (in_edge_t_conflict)SUB168(auVar5._0_16_,8);
  (bb->out_edges).head = (out_edge_t)SUB168(auVar5._16_16_,0);
  (bb->out_edges).tail = (out_edge_t)SUB168(auVar5._16_16_,8);
  *(undefined1 (*) [32])((long)&(bb->out_edges).head + 3) = auVar5;
  pbVar3 = (bitmap_el_t *)malloc(0x20);
  pVVar2->varr = pbVar3;
  bb->in = pVVar2;
  pVVar2 = (bitmap_t)malloc(0x18);
  pVVar2->els_num = 0;
  pVVar2->size = 4;
  pbVar3 = (bitmap_el_t *)malloc(0x20);
  pVVar2->varr = pbVar3;
  bb->out = pVVar2;
  pVVar2 = (bitmap_t)malloc(0x18);
  pVVar2->els_num = 0;
  pVVar2->size = 4;
  pbVar3 = (bitmap_el_t *)malloc(0x20);
  pVVar2->varr = pbVar3;
  bb->gen = pVVar2;
  pVVar2 = (bitmap_t)malloc(0x18);
  pVVar2->els_num = 0;
  pVVar2->size = 4;
  pbVar3 = (bitmap_el_t *)malloc(0x20);
  pVVar2->varr = pbVar3;
  bb->kill = pVVar2;
  pVVar2 = (bitmap_t)malloc(0x18);
  pVVar2->els_num = 0;
  pVVar2->size = 4;
  pbVar3 = (bitmap_el_t *)malloc(0x20);
  pVVar2->varr = pbVar3;
  bb->dom_in = pVVar2;
  pVVar2 = (bitmap_t)malloc(0x18);
  pVVar2->els_num = 0;
  pVVar2->size = 4;
  pbVar3 = (bitmap_el_t *)malloc(0x20);
  bb->dom_out = pVVar2;
  pVVar2->varr = pbVar3;
  bb->max_int_pressure = 0;
  bb->max_fp_pressure = 0;
  if (insn != (MIR_insn_t)0x0) {
    if (gen_ctx->optimize_level == 0) {
      uVar1 = *(int *)&insn->field_0x18 - 0xa7;
      if ((uVar1 < 0xe) && ((0x2007U >> (uVar1 & 0x1f) & 1) != 0)) {
        puVar4 = (undefined8 *)gen_malloc(gen_ctx,0x10);
        insn->data = puVar4;
        *puVar4 = bb;
        puVar4[1] = 0;
      }
      else {
        insn->data = bb;
      }
    }
    else {
      elem = create_bb_insn(gen_ctx,insn,bb);
      DLIST_bb_insn_t_append(&bb->bb_insns,elem);
    }
  }
  return bb;
}

Assistant:

static bb_t create_bb (gen_ctx_t gen_ctx, MIR_insn_t insn) {
  bb_t bb = gen_malloc (gen_ctx, sizeof (struct bb));

  bb->pre = bb->rpost = bb->bfs = 0;
  bb->loop_node = NULL;
  DLIST_INIT (bb_insn_t, bb->bb_insns);
  DLIST_INIT (in_edge_t, bb->in_edges);
  DLIST_INIT (out_edge_t, bb->out_edges);
  bb->call_p = bb->flag = bb->reachable_p = FALSE;
  bb->in = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  bb->out = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  bb->gen = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  bb->kill = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  bb->dom_in = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  bb->dom_out = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  bb->max_int_pressure = bb->max_fp_pressure = 0;
  if (insn != NULL) {
    if (optimize_level == 0)
      setup_insn_data (gen_ctx, insn, bb);
    else
      add_new_bb_insn (gen_ctx, insn, bb, TRUE);
  }
  return bb;
}